

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::QPDFArrayItems::iterator::updateIValue(iterator *this)

{
  int iVar1;
  QPDFObjectHandle *pQVar2;
  int iVar3;
  element_type *peVar4;
  QPDFObjectHandle local_30;
  QPDFObjectHandle local_20;
  iterator *local_10;
  iterator *this_local;
  
  local_10 = this;
  peVar4 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  iVar1 = peVar4->item_number;
  peVar4 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  iVar3 = getArrayNItems(peVar4->oh);
  peVar4 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  peVar4->is_end = iVar3 <= iVar1;
  peVar4 = std::
           __shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  if ((peVar4->is_end & 1U) == 0) {
    peVar4 = std::
             __shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    pQVar2 = peVar4->oh;
    std::
    __shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m);
    getArrayItem(&local_30,(int)pQVar2);
    QPDFObjectHandle::operator=(&this->ivalue,&local_30);
    ~QPDFObjectHandle(&local_30);
  }
  else {
    memset(&local_20,0,0x10);
    QPDFObjectHandle(&local_20);
    QPDFObjectHandle::operator=(&this->ivalue,&local_20);
    ~QPDFObjectHandle(&local_20);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::QPDFArrayItems::iterator::updateIValue()
{
    m->is_end = (m->item_number >= m->oh.getArrayNItems());
    if (m->is_end) {
        this->ivalue = QPDFObjectHandle();
    } else {
        this->ivalue = m->oh.getArrayItem(m->item_number);
    }
}